

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DatabaseManager::SetDefaultDatabase
          (DatabaseManager *this,ClientContext *context,string *new_value)

{
  pointer pcVar1;
  InternalException *pIVar2;
  optional_ptr<duckdb::AttachedDatabase,_true> db_entry;
  string local_70;
  optional_ptr<duckdb::AttachedDatabase,_true> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_50 = GetDatabase(this,context,new_value);
  if (local_50.ptr == (AttachedDatabase *)0x0) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Database \"%s\" not found","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar1 = (new_value->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + new_value->_M_string_length);
    InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_70,&local_48);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_50);
  if ((local_50.ptr)->type != TEMP_DATABASE) {
    optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_50);
    if ((local_50.ptr)->type != SYSTEM_DATABASE) {
      ::std::__cxx11::string::_M_assign((string *)&this->default_database);
      return;
    }
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Cannot set the default database to a system database","");
    InternalException::InternalException(pIVar2,&local_70);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Cannot set the default database to a temporary database","");
  InternalException::InternalException(pIVar2,&local_70);
  __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseManager::SetDefaultDatabase(ClientContext &context, const string &new_value) {
	auto db_entry = GetDatabase(context, new_value);

	if (!db_entry) {
		throw InternalException("Database \"%s\" not found", new_value);
	} else if (db_entry->IsTemporary()) {
		throw InternalException("Cannot set the default database to a temporary database");
	} else if (db_entry->IsSystem()) {
		throw InternalException("Cannot set the default database to a system database");
	}

	default_database = new_value;
}